

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

exr_result_t exr_encoding_destroy(exr_const_context_t ctxt,exr_encode_pipeline_t *encode)

{
  long *in_RSI;
  _internal_exr_context *in_RDI;
  exr_encode_pipeline_t nil;
  _internal_exr_context *pctxt;
  undefined1 auStackY_218 [24];
  size_t *in_stack_fffffffffffffe00;
  void **in_stack_fffffffffffffe08;
  exr_transcoding_pipeline_buffer_id_t in_stack_fffffffffffffe14;
  exr_encode_pipeline_t *in_stack_fffffffffffffe18;
  exr_result_t local_4;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_4 = 2;
  }
  else {
    if (in_RSI != (long *)0x0) {
      memset(auStackY_218,0,0x1f8);
      if ((long *)*in_RSI != in_RSI + 0x21) {
        (*in_RDI->free_fn)((void *)*in_RSI);
      }
      internal_encode_free_buffer
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00);
      internal_encode_free_buffer
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00);
      internal_encode_free_buffer
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00);
      internal_encode_free_buffer
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00);
      internal_encode_free_buffer
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00);
      memcpy(in_RSI,auStackY_218,0x1f8);
    }
    if (in_RDI->mode == '\x01') {
      internal_exr_unlock(in_RDI);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_encoding_destroy (exr_const_context_t ctxt, exr_encode_pipeline_t* encode)
{
    INTERN_EXR_PROMOTE_CONST_CONTEXT_OR_ERROR (ctxt);
    if (encode)
    {
        exr_encode_pipeline_t nil = {0};
        if (encode->channels != encode->_quick_chan_store)
            pctxt->free_fn (encode->channels);

        internal_encode_free_buffer (
            encode,
            EXR_TRANSCODE_BUFFER_PACKED,
            (void**) &(encode->packed_buffer),
            &(encode->packed_alloc_size));
        internal_encode_free_buffer (
            encode,
            EXR_TRANSCODE_BUFFER_COMPRESSED,
            &(encode->compressed_buffer),
            &(encode->compressed_alloc_size));
        internal_encode_free_buffer (
            encode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(encode->scratch_buffer_1),
            &(encode->scratch_alloc_size_1));
        internal_encode_free_buffer (
            encode,
            EXR_TRANSCODE_BUFFER_SCRATCH2,
            &(encode->scratch_buffer_2),
            &(encode->scratch_alloc_size_2));
        internal_encode_free_buffer (
            encode,
            EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
            &(encode->packed_sample_count_table),
            &(encode->packed_sample_count_alloc_size));
        *encode = nil;
    }
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
}